

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::remove_filename(path *this)

{
  size_type sVar1;
  bool bVar2;
  undefined8 uVar3;
  ulong uVar4;
  path local_38;
  
  bVar2 = has_filename(this);
  if (bVar2) {
    sVar1 = (this->_path)._M_string_length;
    filename(&local_38,this);
    uVar4 = sVar1 - local_38._path._M_string_length;
    if ((this->_path)._M_string_length < uVar4) {
      uVar3 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",uVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._path._M_dataplus._M_p != &local_38._path.field_2) {
        operator_delete(local_38._path._M_dataplus._M_p,
                        local_38._path.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar3);
    }
    (this->_path)._M_string_length = uVar4;
    (this->_path)._M_dataplus._M_p[uVar4] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._path._M_dataplus._M_p != &local_38._path.field_2) {
      operator_delete(local_38._path._M_dataplus._M_p,
                      local_38._path.field_2._M_allocated_capacity + 1);
    }
  }
  return this;
}

Assistant:

GHC_INLINE path& path::remove_filename()
{
    if (has_filename()) {
        _path.erase(_path.size() - filename()._path.size());
    }
    return *this;
}